

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O1

void ipc_reap(void *arg)

{
  ipc_conn *c;
  
  ipc_close(arg);
  nni_posix_pfd_stop((nni_posix_pfd *)((long)arg + 0x38));
  if (*(ipc_dialer **)((long)arg + 0xd8) != (ipc_dialer *)0x0) {
    nni_posix_ipc_dialer_rele(*(ipc_dialer **)((long)arg + 0xd8));
  }
  nni_posix_pfd_fini((nni_posix_pfd *)((long)arg + 0x38));
  nni_mtx_fini((nni_mtx *)((long)arg + 0xa8));
  nni_free(arg,0x170);
  return;
}

Assistant:

static void
ipc_reap(void *arg)
{
	ipc_conn *c = arg;
	ipc_stop(c);

	if (c->dialer != NULL) {
		nni_posix_ipc_dialer_rele(c->dialer);
	}

	nni_posix_pfd_fini(&c->pfd);

	nni_mtx_fini(&c->mtx);
	NNI_FREE_STRUCT(c);
}